

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O1

void __thiscall ezexample::~ezexample(ezexample *this)

{
  example **ppeVar1;
  example *ec;
  pointer puVar2;
  bool bVar3;
  example **ppeVar4;
  
  if (this->ec->in_use == true) {
    bVar3 = VW::is_ring_example(this->vw_par_ref,this->ec);
    if (bVar3) {
      VW::finish_example(this->vw_par_ref,this->ec);
    }
  }
  ppeVar1 = (this->example_copies)._end;
  for (ppeVar4 = (this->example_copies)._begin; ppeVar4 != ppeVar1; ppeVar4 = ppeVar4 + 1) {
    ec = *ppeVar4;
    if (ec->in_use == true) {
      bVar3 = VW::is_ring_example(this->vw_par_ref,this->ec);
      if (bVar3) {
        VW::finish_example(this->vw_par_ref,ec);
      }
    }
  }
  v_array<example_*>::clear(&this->example_copies);
  free((this->example_copies)._begin);
  puVar2 = (this->past_seeds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    return;
  }
  return;
}

Assistant:

~ezexample()  // calls finish_example *only* if we created our own example!
  {
    if (ec->in_use && VW::is_ring_example(*vw_par_ref, ec))
      VW::finish_example(*vw_par_ref, *ec);
    for (auto ecc : example_copies)
      if (ecc->in_use && VW::is_ring_example(*vw_par_ref, ec))
        VW::finish_example(*vw_par_ref, *ecc);
    example_copies.clear();
    free(example_copies.begin());
  }